

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

int __thiscall soplex::SPxSteepPR<double>::selectLeaveHyper(SPxSteepPR<double> *this,double tol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  pdVar6 = (pSVar5->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pSVar5->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (double *)infinity();
  dVar15 = -*pdVar9;
  uVar10 = (ulong)(uint)(this->bestPrices).super_IdxSet.num;
  piVar8 = (this->bestPrices).super_IdxSet.idx;
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  iVar12 = -1;
  dVar1 = -1.0;
  do {
    dVar13 = dVar1;
    uVar11 = uVar10 & 0xffffffff;
    while( true ) {
      uVar10 = uVar10 - 1;
      if ((int)uVar11 < 1) {
        uVar10 = (ulong)(uint)(pSVar5->updateViols).super_IdxSet.num;
        goto LAB_001cdad5;
      }
      iVar3 = piVar8[uVar10];
      dVar1 = pdVar6[iVar3];
      if (dVar1 < -tol) break;
      iVar4 = (this->bestPrices).super_IdxSet.num;
      (this->bestPrices).super_IdxSet.num = iVar4 + -1;
      piVar8[uVar10] = piVar8[(long)iVar4 + -1];
      (pSVar5->isInfeasible).data[iVar3] = 0;
      uVar11 = (ulong)((int)uVar11 - 1);
    }
    dVar2 = pdVar7[iVar3];
    dVar14 = tol;
    if (tol <= dVar2) {
      dVar14 = dVar2;
    }
    dVar14 = (dVar1 * dVar1) / dVar14;
    dVar1 = dVar14;
    if (dVar14 <= dVar15) {
      dVar1 = dVar15;
      iVar3 = iVar12;
    }
    iVar12 = iVar3;
    dVar15 = dVar1;
    dVar1 = dVar14;
    if ((0.0 <= dVar13) && (dVar1 = dVar13, dVar14 < dVar13)) {
      dVar1 = dVar14;
    }
  } while( true );
LAB_001cdad5:
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  uVar11 = uVar10 & 0xffffffff;
  do {
    uVar10 = uVar10 - 1;
    if ((int)uVar11 < 1) {
      return iVar12;
    }
    piVar8 = (pSVar5->isInfeasible).data;
    iVar3 = (pSVar5->updateViols).super_IdxSet.idx[uVar10];
    if (piVar8[iVar3] == 1) {
      dVar1 = pdVar6[iVar3];
      dVar2 = pdVar7[iVar3];
      dVar14 = tol;
      if (tol <= dVar2) {
        dVar14 = dVar2;
      }
      dVar14 = (dVar1 * dVar1) / dVar14;
      if (dVar13 < dVar14) break;
    }
    uVar11 = (ulong)((int)uVar11 - 1);
  } while( true );
  if (dVar15 < dVar14) {
    iVar12 = iVar3;
    dVar15 = dVar14;
  }
  piVar8[iVar3] = 2;
  DIdxSet::addIdx(&this->bestPrices,iVar3);
  goto LAB_001cdad5;
}

Assistant:

int SPxSteepPR<R>::selectLeaveHyper(R tol)
{
   const R* coPen = this->thesolver->coWeights.get_const_ptr();
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   R leastBest = -1;
   R best = R(-infinity);
   R x;
   int bestIdx = -1;
   int idx = 0;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         x = steeppr::computePrice(x, coPen[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bestIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // is this index a candidate for bestPrices?
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -tol);
         x = steeppr::computePrice(x, coPen[idx], tol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bestIdx = idx;
            }

            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bestIdx;
}